

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapValues.cpp
# Opt level: O3

void TTD::NSSnapValues::EmitScriptFunctionScopeInfo
               (ScriptFunctionScopeInfo *funcScopeInfo,FileWriter *writer,Separator separator)

{
  uint uVar1;
  undefined7 in_register_00000011;
  long lVar2;
  ulong uVar3;
  
  (*writer->_vptr_FileWriter[6])(writer,CONCAT71(in_register_00000011,separator) & 0xffffffff);
  FileWriter::WriteAddr(writer,scopeId,funcScopeInfo->ScopeId,NoSeparator);
  FileWriter::WriteLogTag(writer,ctxTag,funcScopeInfo->ScriptContextLogId,CommaSeparator);
  FileWriter::WriteUInt32(writer,count,(uint)funcScopeInfo->ScopeCount,CommaSeparator);
  FileWriter::WriteSequenceStart_DefaultKey(writer,CommaSeparator);
  if (funcScopeInfo->ScopeCount != 0) {
    lVar2 = 0;
    uVar3 = 0;
    do {
      (*writer->_vptr_FileWriter[6])(writer,(ulong)(lVar2 != 0));
      uVar1 = *(uint *)((long)&funcScopeInfo->ScopeArray->Tag + lVar2);
      (*writer->_vptr_FileWriter[3])(writer,0x21,0);
      (*writer->_vptr_FileWriter[0x14])(writer,(ulong)uVar1,0);
      FileWriter::WriteAddr
                (writer,subscopeId,
                 *(TTD_PTR_ID *)((long)&funcScopeInfo->ScopeArray->IDValue + lVar2),CommaSeparator);
      (*writer->_vptr_FileWriter[7])(writer,0);
      uVar3 = uVar3 + 1;
      lVar2 = lVar2 + 0x10;
    } while (uVar3 < funcScopeInfo->ScopeCount);
  }
  (*writer->_vptr_FileWriter[5])(writer,0);
  (*writer->_vptr_FileWriter[7])(writer,0);
  return;
}

Assistant:

void EmitScriptFunctionScopeInfo(const ScriptFunctionScopeInfo* funcScopeInfo, FileWriter* writer, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);

            writer->WriteAddr(NSTokens::Key::scopeId, funcScopeInfo->ScopeId);
            writer->WriteLogTag(NSTokens::Key::ctxTag, funcScopeInfo->ScriptContextLogId, NSTokens::Separator::CommaSeparator);
            writer->WriteUInt32(NSTokens::Key::count, funcScopeInfo->ScopeCount, NSTokens::Separator::CommaSeparator);

            writer->WriteSequenceStart_DefaultKey(NSTokens::Separator::CommaSeparator);

            for(uint32 i = 0; i < funcScopeInfo->ScopeCount; ++i)
            {
                writer->WriteRecordStart(i != 0 ? NSTokens::Separator::CommaSeparator : NSTokens::Separator::NoSeparator);

                writer->WriteTag<Js::ScopeType>(NSTokens::Key::scopeType, funcScopeInfo->ScopeArray[i].Tag);
                writer->WriteAddr(NSTokens::Key::subscopeId, funcScopeInfo->ScopeArray[i].IDValue, NSTokens::Separator::CommaSeparator);

                writer->WriteRecordEnd();
            }

            writer->WriteSequenceEnd();

            writer->WriteRecordEnd();
        }